

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Chapters::Edition::ExpandAtomsArray(Edition *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  Atom *pAVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  ulong *puVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  iVar3 = this->m_atoms_size;
  uVar4 = this->m_atoms_count;
  if ((int)uVar4 < iVar3) {
    return true;
  }
  iVar10 = 1;
  if (iVar3 != 0) {
    iVar10 = iVar3 * 2;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)iVar10;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x30),8) == 0) {
    uVar11 = SUB168(auVar6 * ZEXT816(0x30),0) | 8;
  }
  puVar8 = (ulong *)operator_new__(uVar11,(nothrow_t *)&std::nothrow);
  if (puVar8 == (ulong *)0x0) {
    return false;
  }
  *puVar8 = (long)iVar10;
  pAVar5 = this->m_atoms;
  if ((int)uVar4 < 1) {
    if (pAVar5 == (Atom *)0x0) goto LAB_00127583;
  }
  else {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)puVar8 + lVar9 + 8) =
           *(undefined8 *)((long)&pAVar5->m_string_uid + lVar9);
      puVar1 = (undefined8 *)((long)&pAVar5->m_uid + lVar9);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)puVar8 + lVar9 + 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      *(undefined8 *)((long)puVar8 + lVar9 + 0x20) =
           *(undefined8 *)((long)&pAVar5->m_stop_timecode + lVar9);
      *(undefined8 *)((long)puVar8 + lVar9 + 0x28) =
           *(undefined8 *)((long)&pAVar5->m_displays + lVar9);
      *(undefined8 *)((long)puVar8 + lVar9 + 0x30) =
           *(undefined8 *)((long)&pAVar5->m_displays_size + lVar9);
      lVar9 = lVar9 + 0x30;
    } while ((ulong)uVar4 * 0x30 != lVar9);
  }
  operator_delete__(&pAVar5[-1].m_displays_size);
LAB_00127583:
  this->m_atoms = (Atom *)(puVar8 + 1);
  this->m_atoms_size = iVar10;
  return true;
}

Assistant:

bool Chapters::Edition::ExpandAtomsArray() {
  if (m_atoms_size > m_atoms_count)
    return true;  // nothing else to do

  const int size = (m_atoms_size == 0) ? 1 : 2 * m_atoms_size;

  Atom* const atoms = new (std::nothrow) Atom[size];

  if (atoms == NULL)
    return false;

  for (int idx = 0; idx < m_atoms_count; ++idx) {
    m_atoms[idx].ShallowCopy(atoms[idx]);
  }

  delete[] m_atoms;
  m_atoms = atoms;

  m_atoms_size = size;
  return true;
}